

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile.cpp
# Opt level: O1

bool __thiscall QLockFilePrivate::isApparentlyStale(QLockFilePrivate *this)

{
  long lVar1;
  qsizetype qVar2;
  bool bVar3;
  int iVar4;
  qint64 qVar5;
  long lVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView lhs;
  QDateTime lastMod;
  LockFileInfo info;
  Data local_d8;
  QDateTime local_d0;
  Data local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  QArrayData *local_b0;
  storage_type_conflict *local_a8;
  long local_a0;
  LockFileInfo local_98;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.pid = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_98.appname.d.d = (Data *)0x0;
  local_98.appname.d.ptr = (char16_t *)0x0;
  local_98.appname.d.size = 0;
  local_98.hostname.d.d = (Data *)0x0;
  local_98.hostname.d.ptr = (storage_type_conflict *)0x0;
  local_98.hostname.d.size = 0;
  local_98.hostid.d.d = (Data *)0x0;
  local_98.hostid.d.ptr = (char *)0x0;
  local_98.hostid.d.size = 0;
  local_98.bootid.d.d = (Data *)0x0;
  local_98.bootid.d.ptr = (char *)0x0;
  local_98.bootid.d.size = 0;
  bVar3 = getLockInfo_helper(&this->fileName,&local_98);
  qVar2 = local_98.hostname.d.size;
  if (bVar3) {
    if (local_98.hostname.d.size == 0) {
      bVar3 = true;
    }
    else {
      QSysInfo::machineHostName();
      if (local_98.hostname.d.size == local_a0) {
        rhs.m_data = local_a8;
        rhs.m_size = local_a0;
        lhs.m_data = local_98.hostname.d.ptr;
        lhs.m_size = local_98.hostname.d.size;
        bVar3 = QtPrivate::equalStrings(lhs,rhs);
      }
      else {
        bVar3 = false;
      }
    }
    if ((qVar2 != 0) && (local_b0 != (QArrayData *)0x0)) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,2,0x10);
      }
    }
    if ((undefined1 *)local_98.hostid.d.size != (undefined1 *)0x0) {
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
      QSysInfo::machineUniqueId();
      if (local_b8 != (undefined1 *)0x0) {
        if (local_b8 == (undefined1 *)local_98.hostid.d.size) {
          iVar4 = bcmp(puStack_c0,local_98.hostid.d.ptr,(size_t)local_b8);
          bVar3 = iVar4 == 0;
        }
        else {
          bVar3 = false;
        }
      }
      if (local_c8.d != (QDateTimePrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_c8.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i = (((QBasicAtomicInt *)&(local_c8.d)->super_QSharedData)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_c8.d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c8.d,1,0x10);
        }
      }
    }
    if (bVar3 != false) {
      if ((undefined1 *)local_98.bootid.d.size != (undefined1 *)0x0) {
        QSysInfo::bootUniqueId();
        bVar3 = true;
        if ((undefined1 *)local_98.bootid.d.size == local_b8) {
          if ((undefined1 *)local_98.bootid.d.size == (undefined1 *)0x0) {
            bVar3 = false;
          }
          else {
            iVar4 = bcmp(local_98.bootid.d.ptr,puStack_c0,local_98.bootid.d.size);
            bVar3 = iVar4 != 0;
          }
        }
        if (local_c8.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_c8.d)->super_QSharedData)->_q_value).super___atomic_base<int>
          ._M_i = (((QBasicAtomicInt *)&(local_c8.d)->super_QSharedData)->_q_value).
                  super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_c8.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_c8.d,1,0x10);
          }
        }
        bVar7 = true;
        if (bVar3) goto LAB_00249d85;
      }
      bVar3 = isProcessRunning(local_98.pid,&local_98.appname);
      bVar7 = true;
      if (!bVar3) goto LAB_00249d85;
    }
  }
  local_c8.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&local_d0,&this->fileName);
  local_d8 = (Data)0x2;
  QFileInfo::fileTime((QFileInfo *)&local_c8.data,(FileTime)&local_d0,(QTimeZone *)0x3);
  QTimeZone::~QTimeZone((QTimeZone *)&local_d8.s);
  QFileInfo::~QFileInfo((QFileInfo *)&local_d0);
  QDateTime::currentDateTimeUtc();
  qVar5 = QDateTime::msecsTo((QDateTime *)&local_c8.data,&local_d0);
  QDateTime::~QDateTime(&local_d0);
  lVar1 = (this->staleLockTime).__r;
  lVar6 = -qVar5;
  if (0 < qVar5) {
    lVar6 = qVar5;
  }
  bVar7 = lVar1 < lVar6 && 0 < lVar1;
  QDateTime::~QDateTime((QDateTime *)&local_c8.data);
LAB_00249d85:
  if (&(local_98.bootid.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.bootid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.bootid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.bootid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_98.bootid.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_98.hostid.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.hostid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.hostid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.hostid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_98.hostid.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_98.hostname.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.hostname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.hostname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.hostname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.hostname.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.appname.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.appname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.appname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_98.appname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_98.appname.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QLockFilePrivate::isApparentlyStale() const
{
    LockFileInfo info;
    if (getLockInfo_helper(fileName, &info)) {
        bool sameHost = info.hostname.isEmpty() || info.hostname == machineName();
        if (!info.hostid.isEmpty()) {
            // Override with the host ID, if we know it.
            QByteArray ourHostId = QSysInfo::machineUniqueId();
            if (!ourHostId.isEmpty())
                sameHost = (ourHostId == info.hostid);
        }

        if (sameHost) {
            if (!info.bootid.isEmpty()) {
                // If we've rebooted, then the lock is definitely stale.
                if (info.bootid != QSysInfo::bootUniqueId())
                    return true;
            }
            if (!isProcessRunning(info.pid, info.appname))
                return true;
        }
    }

    const QDateTime lastMod = QFileInfo(fileName).lastModified(QTimeZone::UTC);
    using namespace std::chrono;
    const milliseconds age{lastMod.msecsTo(QDateTime::currentDateTimeUtc())};
    return staleLockTime > 0ms && abs(age) > staleLockTime;
}